

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SharedDtor(SimpleRecurrentLayerParams *this)

{
  SimpleRecurrentLayerParams *pSVar1;
  SimpleRecurrentLayerParams *this_local;
  
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->activation_ != (ActivationParams *)0x0)) {
    (*(this->activation_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->weightmatrix_ != (WeightParams *)0x0)) {
    (*(this->weightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->recursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->recursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->biasvector_ != (WeightParams *)0x0)) {
    (*(this->biasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void SimpleRecurrentLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete activation_;
  }
  if (this != internal_default_instance()) {
    delete weightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete recursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete biasvector_;
  }
}